

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O2

void joypad_append(JoypadBuffer *buffer,JoypadButtons *buttons,Ticks ticks)

{
  JoypadChunk *pJVar1;
  JoypadState *pJVar2;
  Bool BVar3;
  Bool BVar4;
  Bool BVar5;
  Bool BVar6;
  Bool BVar7;
  Bool BVar8;
  Bool BVar9;
  u8 uVar10;
  JoypadChunk *pJVar11;
  ulong uVar12;
  
  pJVar1 = (buffer->sentinel).prev;
  uVar12 = pJVar1->size;
  pJVar11 = pJVar1;
  if (pJVar1->capacity <= uVar12) {
    pJVar11 = alloc_joypad_chunk(0x1000);
    pJVar11->next = &buffer->sentinel;
    pJVar11->prev = pJVar1;
    pJVar1->next = pJVar11;
    (buffer->sentinel).prev = pJVar11;
    uVar12 = pJVar11->size;
  }
  pJVar2 = pJVar11->data;
  pJVar11->size = uVar12 + 1;
  pJVar2[uVar12].ticks = ticks;
  uVar10 = joypad_pack_buttons(buttons);
  pJVar2[uVar12].buttons = uVar10;
  BVar3 = buttons->up;
  BVar4 = buttons->left;
  BVar5 = buttons->right;
  BVar6 = buttons->start;
  BVar7 = buttons->select;
  BVar8 = buttons->B;
  BVar9 = buttons->A;
  (buffer->last_buttons).down = buttons->down;
  (buffer->last_buttons).up = BVar3;
  (buffer->last_buttons).left = BVar4;
  (buffer->last_buttons).right = BVar5;
  (buffer->last_buttons).start = BVar6;
  (buffer->last_buttons).select = BVar7;
  (buffer->last_buttons).B = BVar8;
  (buffer->last_buttons).A = BVar9;
  return;
}

Assistant:

void joypad_append(JoypadBuffer* buffer, JoypadButtons* buttons, Ticks ticks) {
  JoypadState* state = alloc_joypad_state(buffer);
  state->ticks = ticks;
  state->buttons = joypad_pack_buttons(buttons);
  buffer->last_buttons = *buttons;
}